

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

bool __thiscall QMap<QString,_QString>::contains(QMap<QString,_QString> *this,QString *key)

{
  QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  bool bVar3;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
                 *)0x0) {
    bVar3 = false;
  }
  else {
    cVar2 = std::
            _Rb_tree<QString,_std::pair<const_QString,_QString>,_std::_Select1st<std::pair<const_QString,_QString>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    bVar3 = (_Rb_tree_header *)cVar2._M_node !=
            &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header;
  }
  return bVar3;
}

Assistant:

bool contains(const Key &key) const
    {
        if (!d)
            return false;
        auto i = d->m.find(key);
        return i != d->m.end();
    }